

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(NearestNeighborsIndex *this)

{
  if ((this->_oneof_case_[1] == 200) &&
     ((this->DistanceFunction_).squaredeuclideandistance_ != (SquaredEuclideanDistance *)0x0)) {
    (*(((this->DistanceFunction_).squaredeuclideandistance_)->super_MessageLite)._vptr_MessageLite
      [1])();
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void NearestNeighborsIndex::clear_DistanceFunction() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NearestNeighborsIndex)
  switch (DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      delete DistanceFunction_.squaredeuclideandistance_;
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = DISTANCEFUNCTION_NOT_SET;
}